

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolygonTessellation.h
# Opt level: O1

void anurbs::PolygonTessellation::register_python(module *m)

{
  class_<anurbs::PolygonTessellation> *pcVar1;
  size_type __dnew;
  string name;
  class_<anurbs::PolygonTessellation> cStack_98;
  code *local_90;
  undefined8 local_88;
  code **local_80;
  code *local_78;
  code *local_70 [2];
  arg local_60;
  arg local_50;
  code *local_40;
  undefined8 local_38;
  code *local_30;
  undefined8 local_28;
  
  local_90 = (code *)0x13;
  local_80 = local_70;
  local_80 = (code **)std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_90);
  local_70[0] = local_90;
  *local_80 = (code *)0x546e6f67796c6f50;
  local_80[1] = (code *)0x74616c6c65737365;
  builtin_strncpy((char *)((long)local_80 + 0xf),"tion",4);
  local_78 = local_90;
  *(code *)((long)local_80 + (long)local_90) = (code)0x0;
  pybind11::class_<anurbs::PolygonTessellation>::class_<>
            (&cStack_98,(m->super_object).super_handle.m_ptr,(char *)local_80);
  pybind11::class_<anurbs::PolygonTessellation>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oberbichler[P]ANurbs_external_libraries_pybind11_include_pybind11_detail_init_h:173:28),_pybind11::detail::is_new_style_constructor>
            (&cStack_98,"__init__",(type *)&local_90,(is_new_style_constructor *)&local_60);
  local_90 = compute;
  local_88 = 0;
  local_60.name = "polygon";
  local_60._8_1_ = 2;
  pcVar1 = pybind11::class_<anurbs::PolygonTessellation>::
           def<void(anurbs::PolygonTessellation::*)(anurbs::Polygon_const&),pybind11::arg>
                     (&cStack_98,"compute",(offset_in_Model_to_subr *)&local_90,&local_60);
  local_30 = nb_triangles;
  local_28 = 0;
  pcVar1 = pybind11::class_<anurbs::PolygonTessellation>::
           def<long(anurbs::PolygonTessellation::*)()const>
                     (pcVar1,"nb_triangles",(offset_in_Model_to_subr *)&local_30);
  local_40 = triangle;
  local_38 = 0;
  local_50.name = "index";
  local_50._8_1_ = 2;
  pybind11::class_<anurbs::PolygonTessellation>::
  def<std::tuple<long,long,long>(anurbs::PolygonTessellation::*)(long)const,pybind11::arg>
            (pcVar1,"triangle",(offset_in_Model_to_subr *)&local_40,&local_50);
  pybind11::object::~object((object *)&cStack_98);
  if (local_80 != local_70) {
    operator_delete(local_80,(ulong)(local_70[0] + 1));
  }
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = PolygonTessellation;

        const std::string name = Type::python_name();

        py::class_<Type>(m, name.c_str())
            .def(py::init<>())
            .def("compute", &Type::compute, "polygon"_a)
            .def("nb_triangles", &Type::nb_triangles)
            .def("triangle", &Type::triangle, "index"_a)
        ;
    }